

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_733b66::HandleScriptMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  cmGlobalGenerator *this;
  pointer pbVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  pointer pbVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool all_components;
  bool exclude_from_all;
  string script;
  string component;
  Helper helper;
  undefined1 local_162;
  bool local_161;
  cmExecutionStatus *local_160;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_158;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_150;
  undefined1 local_148 [24];
  undefined8 local_130;
  undefined1 *local_128;
  undefined8 local_120;
  size_type local_118;
  pointer local_110;
  undefined8 local_108;
  string local_100;
  ulong local_e0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_80;
  Helper local_60;
  
  local_160 = status;
  Helper::Helper(&local_60,status);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_60.DefaultComponentName._M_dataplus._M_p,
             local_60.DefaultComponentName._M_dataplus._M_p +
             local_60.DefaultComponentName._M_string_length);
  local_161 = false;
  local_162 = '\0';
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 == pbVar7) {
LAB_0024db68:
    if (pbVar7 == pbVar10) {
LAB_0024df76:
      this = cmMakefile::GetGlobalGenerator(local_60.Makefile);
      bVar4 = true;
      cmGlobalGenerator::AddInstallComponent(this,&local_d8);
      goto LAB_0024df95;
    }
    bVar4 = false;
    bVar2 = false;
    do {
      iVar5 = std::__cxx11::string::compare((char *)pbVar7);
      if (iVar5 == 0) {
        bVar4 = true;
LAB_0024ddfa:
        bVar2 = false;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)pbVar7);
        if (iVar5 == 0) {
          bVar2 = true;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)pbVar7);
          pcVar3 = local_60.Makefile;
          if (iVar5 == 0) {
            bVar2 = false;
          }
          else {
            if (!bVar4) {
              if (bVar2) {
                local_100._M_dataplus._M_p._0_1_ = 1;
                cmMakefile::GetBacktrace(local_60.Makefile);
                std::
                make_unique<cmInstallScriptGenerator,std::__cxx11::string_const&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                          (&local_b8,(bool *)pbVar7,&local_100,(bool *)&local_d8,&local_161,
                           (cmListFileBacktrace *)&local_162);
                local_158._M_head_impl = (cmInstallGenerator *)local_b8._M_dataplus._M_p;
                local_b8._M_dataplus._M_p = (pointer)0x0;
                cmMakefile::AddInstallGenerator
                          (pcVar3,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                   *)&local_158);
                if (local_158._M_head_impl != (cmInstallGenerator *)0x0) {
                  (*((local_158._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])
                            ();
                }
                local_158._M_head_impl = (cmInstallGenerator *)0x0;
                if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
                  (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
                }
                local_b8._M_dataplus._M_p = (pointer)0x0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
                }
                goto LAB_0024ddfa;
              }
              goto LAB_0024de08;
            }
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            pcVar1 = (pbVar7->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,pcVar1,pcVar1 + pbVar7->_M_string_length);
            local_148._0_8_ = local_100._M_string_length;
            local_148._8_8_ = local_100._M_dataplus._M_p;
            __str._M_str = "$<INSTALL_PREFIX>";
            __str._M_len = 0x11;
            iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_148,0,0x11,
                               __str);
            if (iVar5 != 0) {
              bVar4 = cmsys::SystemTools::FileIsFullPath(&local_100);
              if (!bVar4) {
                psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_60.Makefile);
                local_148._8_8_ = (psVar6->_M_dataplus)._M_p;
                local_148._0_8_ = psVar6->_M_string_length;
                local_148._16_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_b8._M_dataplus._M_p = (pointer)0x0;
                local_b8._M_string_length = 1;
                local_128 = (undefined1 *)((long)&local_b8.field_2 + 8);
                local_b8.field_2._M_local_buf[8] = '/';
                local_130 = 1;
                local_120 = 0;
                local_110 = (pbVar7->_M_dataplus)._M_p;
                local_118 = pbVar7->_M_string_length;
                local_108 = 0;
                views._M_len = 3;
                views._M_array = (iterator)local_148;
                local_b8.field_2._M_allocated_capacity = (size_type)local_128;
                cmCatViews(&local_80,views);
                std::__cxx11::string::operator=((string *)&local_100,(string *)&local_80);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
                    &local_80.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                           local_80._M_dataplus._M_p._0_1_),
                                  local_80.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = cmsys::SystemTools::FileIsDirectory(&local_100);
              if (bVar4) {
                local_148._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x10)
                ;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_148,"given a directory as value of SCRIPT argument.","");
                std::__cxx11::string::_M_assign((string *)&local_160->Error);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x10)) {
                  operator_delete((void *)local_148._0_8_,
                                  (ulong)((long)&((_Alloc_hider *)local_148._16_8_)->_M_p + 1));
                }
                _Var8._M_p = local_100._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) goto LAB_0024df6a;
                goto LAB_0024df72;
              }
            }
            pcVar3 = local_60.Makefile;
            local_80._M_dataplus._M_p._0_1_ = 0;
            cmMakefile::GetBacktrace(local_60.Makefile);
            std::
            make_unique<cmInstallScriptGenerator,std::__cxx11::string&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                      (&local_b8,(bool *)&local_100,&local_80,(bool *)&local_d8,&local_161,
                       (cmListFileBacktrace *)&local_162);
            local_150._M_head_impl = (cmInstallGenerator *)local_b8._M_dataplus._M_p;
            local_b8._M_dataplus._M_p = (pointer)0x0;
            cmMakefile::AddInstallGenerator
                      (pcVar3,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                               *)&local_150);
            if (local_150._M_head_impl != (cmInstallGenerator *)0x0) {
              (*((local_150._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
            }
            local_150._M_head_impl = (cmInstallGenerator *)0x0;
            if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
            }
            local_b8._M_dataplus._M_p = (pointer)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        bVar4 = false;
      }
LAB_0024de08:
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar10);
    if (bVar4) {
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"given no value for SCRIPT argument.","");
      std::__cxx11::string::_M_assign((string *)&local_160->Error);
    }
    else {
      if (!bVar2) goto LAB_0024df76;
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"given no value for CODE argument.","");
      std::__cxx11::string::_M_assign((string *)&local_160->Error);
    }
  }
  else {
    local_e0 = 0;
    uVar9 = 0;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(pbVar7 + uVar9));
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((iVar5 == 0) &&
         (uVar9 + 1 <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5))) {
        std::__cxx11::string::_M_assign((string *)&local_d8);
        local_e0 = (ulong)((int)local_e0 + 1);
        pbVar7 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar9 = uVar9 + 1;
      }
      iVar5 = std::__cxx11::string::compare((char *)(pbVar7 + uVar9));
      if (iVar5 == 0) {
        local_161 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9));
        if (iVar5 == 0) {
          local_162 = '\x01';
        }
      }
      uVar9 = uVar9 + 1;
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar9 < (ulong)((long)pbVar10 - (long)pbVar7 >> 5));
    if ((int)local_e0 < 2) {
      if (((int)local_e0 != 1) || (local_162 == '\0')) goto LAB_0024db68;
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"ALL_COMPONENTS and COMPONENT are mutually exclusive","");
      std::__cxx11::string::_M_assign((string *)&local_160->Error);
    }
    else {
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,
                 "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
                 ,"");
      std::__cxx11::string::_M_assign((string *)&local_160->Error);
    }
  }
  local_100.field_2._M_allocated_capacity = local_148._16_8_;
  _Var8._M_p = (pointer)local_148._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x10)) {
LAB_0024df6a:
    operator_delete(_Var8._M_p,
                    (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_100.field_2._M_allocated_capacity)->_M_dataplus)._M_p
                           + 1));
  }
LAB_0024df72:
  bVar4 = false;
LAB_0024df95:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.DefaultComponentName._M_dataplus._M_p != &local_60.DefaultComponentName.field_2) {
    operator_delete(local_60.DefaultComponentName._M_dataplus._M_p,
                    local_60.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool HandleScriptMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  std::string component = helper.DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;
  bool all_components = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    } else if (args[i] == "ALL_COMPONENTS") {
      all_components = true;
    }
  }

  if (componentCount > 1) {
    status.SetError("given more than one COMPONENT for the SCRIPT or CODE "
                    "signature of the INSTALL command. "
                    "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  if (all_components && componentCount == 1) {
    status.SetError("ALL_COMPONENTS and COMPONENT are mutually exclusive");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmHasLiteralPrefix(script, "$<INSTALL_PREFIX>")) {
        if (!cmSystemTools::FileIsFullPath(script)) {
          script =
            cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', arg);
        }
        if (cmSystemTools::FileIsDirectory(script)) {
          status.SetError("given a directory as value of SCRIPT argument.");
          return false;
        }
      }
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          script, false, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          code, true, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    }
  }

  if (doing_script) {
    status.SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    status.SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}